

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O0

void __thiscall lsh::table::table(table *this,classic *c)

{
  ushort uVar1;
  uint uVar2;
  result_type_conflict1 rVar3;
  result_type rVar4;
  uint uVar5;
  reference rVar6;
  unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  local_27e8;
  vector local_27b0;
  reference local_2790;
  uint local_2780;
  allocator<bool> local_2779;
  uint i_1;
  vector<bool,_std::allocator<bool>_> c_1;
  uniform_int_distribution<int> indices;
  mt19937 generator;
  random_device random;
  uint i;
  uint p;
  uint s;
  uint d;
  classic *c_local;
  table *this_local;
  
  std::
  unordered_map<unsigned_int,_lsh::vector,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_lsh::vector>_>_>
  ::unordered_map(&this->vectors_);
  std::vector<lsh::vector,_std::allocator<lsh::vector>_>::vector(&this->masks_);
  std::
  vector<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
  ::vector(&this->partitions_);
  uVar2 = c->dimensions;
  uVar1 = c->samples;
  uVar5 = (uint)c->partitions;
  this->dimensions_ = uVar2;
  std::vector<lsh::vector,_std::allocator<lsh::vector>_>::reserve(&this->masks_,(ulong)uVar5);
  std::
  vector<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
  ::reserve(&this->partitions_,(ulong)uVar5);
  for (random.field_0._M_mt._M_p._0_4_ = 0; (uint)random.field_0._M_mt._M_p._0_4_ < uVar5;
      random.field_0._M_mt._M_p._0_4_ = random.field_0._M_mt._M_p._0_4_ + 1) {
    std::random_device::random_device((random_device *)&generator._M_p);
    rVar3 = std::random_device::operator()((random_device *)&generator._M_p);
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::mersenne_twister_engine
              ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)&indices,(ulong)rVar3);
    std::uniform_int_distribution<int>::uniform_int_distribution
              ((uniform_int_distribution<int> *)
               &c_1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_end_of_storage,0,uVar2 - 1);
    std::allocator<bool>::allocator(&local_2779);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&i_1,(ulong)uVar2,&local_2779);
    std::allocator<bool>::~allocator(&local_2779);
    for (local_2780 = 0; local_2780 < uVar1; local_2780 = local_2780 + 1) {
      rVar4 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)
                         &c_1.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)&indices);
      rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)&i_1,(long)rVar4);
      local_2790 = rVar6;
      std::_Bit_reference::operator=(&local_2790,true);
    }
    lsh::vector::vector(&local_27b0,(vector<bool,_std::allocator<bool>_> *)&i_1);
    std::vector<lsh::vector,_std::allocator<lsh::vector>_>::push_back(&this->masks_,&local_27b0);
    lsh::vector::~vector(&local_27b0);
    local_27e8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    local_27e8._M_h._M_rehash_policy._4_4_ = 0;
    local_27e8._M_h._M_rehash_policy._M_next_resize = 0;
    local_27e8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_27e8._M_h._M_element_count = 0;
    local_27e8._M_h._M_buckets = (__buckets_ptr)0x0;
    local_27e8._M_h._M_bucket_count = 0;
    local_27e8._M_h._M_single_bucket = (__node_base_ptr)0x0;
    std::
    unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::unordered_map(&local_27e8);
    std::
    vector<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
    ::push_back(&this->partitions_,&local_27e8);
    std::
    unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::~unordered_map(&local_27e8);
    std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)&i_1);
    std::random_device::~random_device((random_device *)&generator._M_p);
  }
  return;
}

Assistant:

table::table(const classic& c) {
    unsigned int d = c.dimensions;
    unsigned int s = c.samples;
    unsigned int p = c.partitions;

    this->dimensions_ = d;
    this->masks_.reserve(p);
    this->partitions_.reserve(p);

    for (unsigned int i = 0; i < p; i++) {
      std::random_device random;
      std::mt19937 generator(random());
      std::uniform_int_distribution<> indices(0, d - 1);

      std::vector<bool> c(d);

      for (unsigned int i = 0; i < s; i++) {
        c[indices(generator)] = 1;
      }

      this->masks_.push_back(vector(c));
      this->partitions_.push_back(partition());
    }
  }